

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O2

void display_rip(int how,char *kilbuf,char *pbuf,long umoney)

{
  nh_menuitem *pnVar1;
  valuable_data *pvVar2;
  short sVar3;
  valuable_data *pvVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  _func_void_nh_menuitem_ptr_int_nh_bool_char_ptr_int_char_ptr_int_int *p_Var10;
  boolean bVar11;
  char cVar12;
  int i;
  int iVar13;
  int iVar14;
  size_t sVar15;
  char *pcVar16;
  val_list *pvVar17;
  ulong uVar18;
  obj *poVar19;
  dungeon *pdVar20;
  long lVar21;
  long lVar22;
  monst *mtmp;
  ulong uVar23;
  char *pcVar24;
  char *pcVar25;
  int *piVar26;
  menulist menu;
  char outrip_buf [256];
  
  iVar9 = program_state.stopprint;
  program_state.stopprint = 0;
  init_menulist(&menu);
  if (program_state.game_running == 0) {
    program_state.stopprint = 1;
  }
  else {
    (*windowprocs.win_pause)(P_MESSAGE);
    if ((how < 0xc) && (flags.tombstone != '\0')) {
      if (killer_format == 0) {
LAB_001918a8:
        strcpy(outrip_buf,killed_by_prefix[how]);
        pcVar16 = an(killer);
      }
      else {
        if (killer_format != 1) {
          if (killer_format == 2) {
            strcpy(outrip_buf,killer);
            goto LAB_001918df;
          }
          warning("bad killer format?");
          goto LAB_001918a8;
        }
        strcpy(outrip_buf,killed_by_prefix[how]);
        pcVar16 = killer;
      }
      strcat(outrip_buf,pcVar16);
    }
  }
LAB_001918df:
  if ((u.uhave._0_1_ & 1) == 0) {
    if (how == 0xf) {
      bVar11 = on_level(&u.uz,&dungeon_topology.d_astral_level);
      if (bVar11 == '\0') {
        poVar19 = carrying(0xd8);
        if (poVar19 != (obj *)0x0) {
          sVar15 = strlen(kilbuf);
          builtin_strncpy(kilbuf + sVar15," (with a fake Amulet)",0x16);
        }
      }
      else {
        sVar15 = strlen(kilbuf);
        builtin_strncpy(kilbuf + sVar15," (in celestial disgrace)",0x19);
      }
    }
  }
  else {
    sVar15 = strlen(kilbuf);
    builtin_strncpy(kilbuf + sVar15," (with the Amulet)",0x13);
  }
  if (program_state.stopprint == 0) {
    pcVar16 = Goodbye();
    if (how == 0x11) {
      pcVar24 = "Demigoddess";
      if (flags.female == '\0') {
        pcVar24 = "Demigod";
      }
    }
    else {
      pcVar24 = urole.name.f;
      if (urole.name.f == (char *)0x0) {
        pcVar24 = urole.name.m;
      }
      if (flags.female == '\0') {
        pcVar24 = urole.name.m;
      }
    }
    sprintf(pbuf,"%s %s the %s...",pcVar16,plname,pcVar24);
    lVar21 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
    lVar21 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
    }
    lVar21 = (long)menu.icount;
    menu.items[lVar21].accel = '\0';
    menu.items[lVar21].group_accel = '\0';
    menu.items[lVar21].selected = '\0';
    menu.items[lVar21].id = 0;
    menu.items[lVar21].role = MI_TEXT;
    menu.items[lVar21].caption[0] = '\0';
    menu.icount = menu.icount + 1;
  }
  if (how - 0xfU < 3) {
    for (pvVar17 = valuables; pvVar4 = pvVar17->list, pvVar4 != (valuable_data *)0x0;
        pvVar17 = pvVar17 + 1) {
      uVar5 = pvVar17->size;
      if (pvVar17->size < 1) {
        uVar5 = 0;
      }
      for (lVar21 = 0; (ulong)uVar5 * 0x10 != lVar21; lVar21 = lVar21 + 0x10) {
        *(undefined8 *)((long)&pvVar4->count + lVar21) = 0;
      }
    }
    get_valuables(invent);
    iVar13 = u.urscore;
    for (pvVar17 = valuables; pvVar4 = pvVar17->list, pvVar4 != (valuable_data *)0x0;
        pvVar17 = pvVar17 + 1) {
      uVar5 = pvVar17->size;
      if (pvVar17->size < 1) {
        uVar5 = 0;
      }
      for (lVar21 = 0; (ulong)uVar5 * 0x10 != lVar21; lVar21 = lVar21 + 0x10) {
        lVar22 = *(long *)((long)&pvVar4->count + lVar21);
        if (lVar22 != 0) {
          iVar13 = iVar13 + (int)lVar22 *
                            (int)objects[*(int *)((long)&pvVar4->typ + lVar21)].oc_cost;
          u.urscore = iVar13;
        }
      }
    }
    artifact_score(invent,'\x01',&menu);
    keepdogs(1,(char *)0x0);
    **viz_array = **viz_array | 2;
    mtmp = mydogs;
    if (program_state.stopprint == 0) {
      builtin_strncpy(pbuf,"You",4);
    }
    if (mtmp == (monst *)0x0) {
      if (program_state.stopprint == 0) {
        sVar15 = strlen(pbuf);
        (pbuf + sVar15)[0] = ' ';
        (pbuf + sVar15)[1] = '\0';
        goto LAB_00191cc8;
      }
    }
    else {
      for (; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
        if (program_state.stopprint == 0) {
          pcVar16 = eos(pbuf);
          pcVar24 = mon_nam(mtmp);
          sprintf(pcVar16," and %s",pcVar24);
        }
        if (mtmp->mtame != '\0') {
          u.urscore = u.urscore + mtmp->mhp;
        }
      }
      if (program_state.stopprint == 0) {
        lVar21 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,pbuf);
        menu.icount = menu.icount + 1;
      }
      *pbuf = '\0';
LAB_00191cc8:
      if (program_state.stopprint == 0) {
        pcVar16 = eos(pbuf);
        pcVar24 = "escaped from the dungeon";
        if (how == 0x10) {
          pcVar24 = "defied the gods and escaped";
        }
        pcVar25 = "went to your reward";
        if (how != 0x11) {
          pcVar25 = pcVar24;
        }
        pcVar24 = "s";
        if (u.urscore == 1) {
          pcVar24 = "";
        }
        sprintf(pcVar16,"%s with %d point%s,",pcVar25,(ulong)(uint)u.urscore,pcVar24);
        lVar21 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,pbuf);
        menu.icount = menu.icount + 1;
        if (program_state.stopprint == 0) {
          artifact_score(invent,'\0',&menu);
        }
      }
    }
    for (pvVar17 = valuables; pvVar4 = pvVar17->list, pvVar4 != (valuable_data *)0x0;
        pvVar17 = pvVar17 + 1) {
      iVar13 = pvVar17->size;
      for (uVar18 = 1; (long)uVar18 < (long)iVar13; uVar18 = uVar18 + 1) {
        lVar21 = pvVar4[uVar18].count;
        if (lVar21 != 0) {
          iVar14 = pvVar4[uVar18].typ;
          uVar8 = *(undefined4 *)&pvVar4[uVar18].field_0xc;
          for (uVar23 = uVar18 & 0xffffffff; 0 < (int)uVar23; uVar23 = (ulong)((int)uVar23 - 1)) {
            if (lVar21 <= pvVar4[uVar23 - 1].count) goto LAB_00191e38;
            pvVar2 = pvVar4 + uVar23;
            iVar6 = pvVar4[uVar23 - 1].typ;
            uVar7 = *(undefined4 *)&pvVar4[uVar23 - 1].field_0xc;
            pvVar2->count = pvVar4[uVar23 - 1].count;
            pvVar2->typ = iVar6;
            *(undefined4 *)&pvVar2->field_0xc = uVar7;
          }
          uVar23 = 0;
LAB_00191e38:
          pvVar4[uVar23].count = lVar21;
          pvVar4[uVar23].typ = iVar14;
          *(undefined4 *)&pvVar4[uVar23].field_0xc = uVar8;
        }
      }
      piVar26 = &pvVar4->typ;
      lVar21 = 0;
      iVar14 = program_state.stopprint;
      while ((lVar21 < iVar13 && (iVar14 == 0))) {
        lVar22 = ((valuable_data *)(piVar26 + -2))->count;
        if (lVar22 == 0) {
          iVar14 = 0;
        }
        else {
          iVar14 = *piVar26;
          if (iVar14 < 0x206 || objects[iVar14].oc_class != '\r') {
            poVar19 = mksobj(level,iVar14,'\0','\0');
            discover_object((int)poVar19->otyp,'\x01','\x01');
            poVar19->field_0x4a = poVar19->field_0x4a | 0x30;
            poVar19->onamelth = '\0';
            poVar19->quan = (int)lVar22;
            pcVar16 = xname(poVar19);
            sVar3 = objects[iVar14].oc_cost;
            pcVar24 = currency(2);
            sprintf(pbuf,"%8ld %s (worth %ld %s),",lVar22,pcVar16,sVar3 * lVar22,pcVar24);
            obfree(poVar19,(obj *)0x0);
          }
          else {
            pcVar16 = "s";
            if (lVar22 == 1) {
              pcVar16 = "";
            }
            sprintf(pbuf,"%8ld worthless piece%s of colored glass,",lVar22,pcVar16);
          }
          lVar22 = (long)menu.size;
          if (menu.size <= menu.icount) {
            menu.size = menu.size * 2;
            menu.items = (nh_menuitem *)realloc(menu.items,lVar22 * 0x218);
          }
          pnVar1 = menu.items + menu.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,pbuf);
          menu.icount = menu.icount + 1;
          iVar14 = program_state.stopprint;
        }
        lVar21 = lVar21 + 1;
        piVar26 = piVar26 + 4;
      }
    }
  }
  else {
    if (program_state.stopprint != 0) goto LAB_001923aa;
    lVar21 = (long)u.uz.dnum;
    if (u.uz.dlevel < '\x01' && lVar21 == 0) {
      if (u.uz.dlevel < '\0') {
        pcVar16 = "passed away";
      }
      else {
        pcVar16 = ends[how];
      }
      sprintf(pbuf,"You %s beyond the confines of the dungeon",pcVar16);
    }
    else {
      bVar11 = on_level(&u.uz,&dungeon_topology.d_astral_level);
      pdVar20 = (dungeon *)"The Astral Plane";
      if (bVar11 == '\0') {
        pdVar20 = dungeons + lVar21;
      }
      sprintf(pbuf,"You %s in %s",ends[how],pdVar20);
      if ((u.uz.dnum != dungeon_topology.d_astral_level.dnum) &&
         (bVar11 = on_level(&u.uz,&dungeon_topology.d_knox_level), bVar11 == '\0')) {
        pcVar16 = eos(pbuf);
        bVar11 = In_quest(&u.uz);
        if (bVar11 == '\0') {
          cVar12 = depth(&u.uz);
        }
        else {
          cVar12 = dunlev(&u.uz);
        }
        sprintf(pcVar16," on dungeon level %d",(ulong)(uint)(int)cVar12);
      }
    }
    pcVar16 = eos(pbuf);
    pcVar24 = "s";
    if (u.urscore == 1) {
      pcVar24 = "";
    }
    sprintf(pcVar16," with %d point%s,",(ulong)(uint)u.urscore,pcVar24);
    lVar21 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
  }
  if (program_state.stopprint == 0) {
    pcVar24 = "s";
    pcVar16 = "s";
    if (umoney == 1) {
      pcVar16 = "";
    }
    pcVar25 = "s";
    if (moves == 1) {
      pcVar25 = "";
    }
    sprintf(pbuf,"and %ld piece%s of gold, after %u move%s.",umoney,pcVar16,(ulong)moves,pcVar25);
    lVar21 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pbuf);
    menu.icount = menu.icount + 1;
    if (program_state.stopprint == 0) {
      if (u.uhpmax == 1) {
        pcVar24 = "";
      }
      sprintf(pbuf,"You were level %d with a maximum of %d hit point%s when you %s.",
              (ulong)(uint)u.ulevel,(ulong)(uint)u.uhpmax,pcVar24,ends[how]);
      lVar21 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,pbuf);
      menu.icount = menu.icount + 1;
      lVar21 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar21 * 0x218);
      }
      pnVar1 = menu.items;
      lVar21 = (long)menu.icount;
      menu.items[lVar21].accel = '\0';
      menu.items[lVar21].group_accel = '\0';
      menu.items[lVar21].selected = '\0';
      menu.items[lVar21].caption[0] = '\0';
      menu.items[lVar21].id = 0;
      p_Var10 = windowprocs.win_outrip;
      menu.items[lVar21].role = MI_TEXT;
      iVar13 = menu.icount + 1;
      menu.icount = iVar13;
      if (program_state.stopprint == 0) {
        iVar14 = getyear();
        (*p_Var10)(pnVar1,iVar13,how < 0xc,plname,(int)umoney,outrip_buf,how,iVar14);
      }
    }
  }
LAB_001923aa:
  free(menu.items);
  program_state.stopprint = iVar9;
  return;
}

Assistant:

void display_rip(int how, char *kilbuf, char *pbuf, long umoney)
{
	char outrip_buf[BUFSZ];
	boolean show_endwin = FALSE;
	struct menulist menu;
	int saved_stopprint = done_stopprint;

	/* always show this under normal circumstances */
	done_stopprint = 0;

	init_menulist(&menu);

	/* clean up unneeded windows */
	if (program_state.game_running) {
	    win_pause_output(P_MESSAGE);

	    if (!done_stopprint || flags.tombstone)
		show_endwin = TRUE;

	    if ((how <= GENOCIDED || how == DISINTEGRATED) &&
		flags.tombstone && show_endwin) {
		/* Put together death description */
		switch (killer_format) {
		    default: warning("bad killer format?");
		    case KILLED_BY_AN:
			strcpy(outrip_buf, killed_by_prefix[how]);
			strcat(outrip_buf, an(killer));
			break;
		    case KILLED_BY:
			strcpy(outrip_buf, killed_by_prefix[how]);
			strcat(outrip_buf, killer);
			break;
		    case NO_KILLER_PREFIX:
			strcpy(outrip_buf, killer);
			break;
		}
	    }
	} else {
	    done_stopprint = 1;
	}

/* changing kilbuf really changes killer. we do it this way because
   killer is declared a (const char *)
*/
	if (u.uhave.amulet) strcat(kilbuf, " (with the Amulet)");
	else if (how == ESCAPED) {
	    if (Is_astralevel(&u.uz))	/* offered Amulet to wrong deity */
		strcat(kilbuf, " (in celestial disgrace)");
	    else if (carrying(FAKE_AMULET_OF_YENDOR))
		strcat(kilbuf, " (with a fake Amulet)");
		/* don't bother counting to see whether it should be plural */
	}

	if (!done_stopprint) {
	    sprintf(pbuf, "%s %s the %s...", Goodbye(), plname,
		   how != ASCENDED ?
		      (const char *) ((flags.female && urole.name.f) ?
		         urole.name.f : urole.name.m) :
		      (const char *) (flags.female ? "Demigoddess" : "Demigod"));
	    add_menutext(&menu, pbuf);
	    add_menutext(&menu, "");
	}

	if (how == ESCAPED || how == DEFIED || how == ASCENDED) {
	    struct monst *mtmp;
	    struct obj *otmp;
	    const struct val_list *val;
	    int i;

	    for (val = valuables; val->list; val++)
		for (i = 0; i < val->size; i++) {
		    val->list[i].count = 0L;
		}
	    get_valuables(invent);

	    /* add points for collected valuables */
	    for (val = valuables; val->list; val++)
		for (i = 0; i < val->size; i++)
		    if (val->list[i].count != 0L)
			u.urscore += val->list[i].count
				  * (long)objects[val->list[i].typ].oc_cost;

	    /* count the points for artifacts */
	    artifact_score(invent, TRUE, &menu);

	    keepdogs(1, NULL);	/* only pets follow you */
	    viz_array[0][0] |= IN_SIGHT; /* need visibility for naming */
	    mtmp = mydogs;
	    if (!done_stopprint) strcpy(pbuf, "You");
	    if (mtmp) {
		while (mtmp) {
		    if (!done_stopprint)
			sprintf(eos(pbuf), " and %s", mon_nam(mtmp));
		    if (mtmp->mtame)
			u.urscore += mtmp->mhp;
		    mtmp = mtmp->nmon;
		}
		if (!done_stopprint) add_menutext(&menu, pbuf);
		pbuf[0] = '\0';
	    } else {
		if (!done_stopprint) strcat(pbuf, " ");
	    }
	    if (!done_stopprint) {
		sprintf(eos(pbuf), "%s with %d point%s,",
			how==ASCENDED ? "went to your reward" :
			how==DEFIED   ? "defied the gods and escaped" :
					"escaped from the dungeon",
			u.urscore, plur(u.urscore));
		add_menutext(&menu, pbuf);
	    }

	    if (!done_stopprint)
		artifact_score(invent, FALSE, &menu);	/* list artifacts */

	    /* list valuables here */
	    for (val = valuables; val->list; val++) {
		sort_valuables(val->list, val->size);
		for (i = 0; i < val->size && !done_stopprint; i++) {
		    int typ = val->list[i].typ;
		    long count = val->list[i].count;

		    if (count == 0L) continue;
		    if (objects[typ].oc_class != GEM_CLASS || typ <= LAST_GEM) {
			otmp = mksobj(level, typ, FALSE, FALSE);
			makeknown(otmp->otyp);
			otmp->known = 1;	/* for fake amulets */
			otmp->dknown = 1;	/* seen it (blindness fix) */
			otmp->onamelth = 0;
			otmp->quan = count;
			sprintf(pbuf, "%8ld %s (worth %ld %s),",
				count, xname(otmp),
				count * (long)objects[typ].oc_cost, currency(2L));
			obfree(otmp, NULL);
		    } else {
			sprintf(pbuf,
				"%8ld worthless piece%s of colored glass,",
				count, plur(count));
		    }
		    add_menutext(&menu, pbuf);
		}
	    }

	} else if (!done_stopprint) {
	    /* did not escape or ascend */
	    if (u.uz.dnum == 0 && u.uz.dlevel <= 0) {
		/* level teleported out of the dungeon; `how' is DIED,
		   due to falling or to "arriving at heaven prematurely" */
		sprintf(pbuf, "You %s beyond the confines of the dungeon",
			(u.uz.dlevel < 0) ? "passed away" : ends[how]);
	    } else {
		/* more conventional demise */
		const char *where = dungeons[u.uz.dnum].dname;

		if (Is_astralevel(&u.uz)) where = "The Astral Plane";
		sprintf(pbuf, "You %s in %s", ends[how], where);
		if (!In_endgame(&u.uz) && !Is_knox(&u.uz))
		    sprintf(eos(pbuf), " on dungeon level %d",
			    In_quest(&u.uz) ? dunlev(&u.uz) : depth(&u.uz));
	    }

	    sprintf(eos(pbuf), " with %d point%s,",
		    u.urscore, plur(u.urscore));
	    add_menutext(&menu, pbuf);
	}

	if (!done_stopprint) {
	    sprintf(pbuf, "and %ld piece%s of gold, after %u move%s.",
		    umoney, plur(umoney), moves, plur(moves));
	    add_menutext(&menu, pbuf);
	}
	if (!done_stopprint) {
	    sprintf(pbuf,
	     "You were level %d with a maximum of %d hit point%s when you %s.",
		    u.ulevel, u.uhpmax, plur(u.uhpmax), ends[how]);
	    add_menutext(&menu, pbuf);
	    add_menutext(&menu, "");
	}
	if (!done_stopprint)
	    outrip(menu.items, menu.icount,
		   (how <= GENOCIDED || how == DISINTEGRATED), plname, umoney,
		   outrip_buf, how, getyear());

	free(menu.items);

	done_stopprint = saved_stopprint;
}